

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O2

int cuddInitLinear(DdManager *table)

{
  long *plVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar8 = table->size;
  iVar4 = ((int)(uVar8 - 1) >> 6) + 1;
  uVar6 = iVar4 * uVar8;
  plVar1 = (long *)malloc((long)(int)uVar6 * 8);
  table->linear = plVar1;
  if (plVar1 == (long *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    iVar3 = 0;
  }
  else {
    table->memused = table->memused + (long)(int)uVar6 * 8;
    table->linearSize = uVar8;
    uVar2 = 0;
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar2;
    }
    for (; uVar7 != uVar2; uVar2 = uVar2 + 1) {
      plVar1[uVar2] = 0;
    }
    iVar5 = 0;
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    iVar3 = 1;
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      plVar1[(int)((uVar6 >> 6) + iVar5)] = (long)(1 << ((byte)uVar6 & 0x1f));
      iVar5 = iVar5 + iVar4;
    }
  }
  return iVar3;
}

Assistant:

int
cuddInitLinear(
  DdManager * table)
{
    int words;
    int wordsPerRow;
    int nvars;
    int word;
    int bit;
    int i;
    long *linear;

    nvars = table->size;
    wordsPerRow = ((nvars - 1) >> LOGBPL) + 1;
    words = wordsPerRow * nvars;
    table->linear = linear = ABC_ALLOC(long,words);
    if (linear == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    table->memused += words * sizeof(long);
    table->linearSize = nvars;
    for (i = 0; i < words; i++) linear[i] = 0;
    for (i = 0; i < nvars; i++) {
        word = wordsPerRow * i + (i >> LOGBPL);
        bit  = i & (BPL-1);
        linear[word] = 1 << bit;
    }
    return(1);

}